

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader14.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::NodeLoader14::begin__node(NodeLoader14 *this,node__AttributeData *attributeData)

{
  byte bVar1;
  uint *in_RSI;
  long in_RDI;
  bool bVar2;
  node__AttributeData attrData;
  uint local_48 [2];
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined4 local_28;
  undefined8 local_20;
  undefined8 local_18;
  uint *local_10;
  
  local_10 = in_RSI;
  node__AttributeData::node__AttributeData((node__AttributeData *)0xbb5001);
  local_40 = *(undefined8 *)(local_10 + 2);
  local_38 = *(undefined8 *)(local_10 + 4);
  local_30 = *(undefined8 *)(local_10 + 6);
  switch(local_10[8]) {
  case 0:
    local_28 = 0;
    break;
  case 1:
    local_28 = 1;
    break;
  case 2:
    local_28 = 2;
    break;
  case 3:
    local_28 = 3;
  }
  bVar2 = (*local_10 & 1) == 1;
  if (bVar2) {
    local_20 = *(undefined8 *)(local_10 + 10);
    local_18 = *(undefined8 *)(local_10 + 0xc);
  }
  local_48[0] = (uint)bVar2;
  bVar1 = (**(code **)(**(long **)(in_RDI + 0x18) + 0x10))(*(long **)(in_RDI + 0x18),local_48);
  return (bool)(bVar1 & 1);
}

Assistant:

bool NodeLoader14::begin__node( const COLLADASaxFWL14::node__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__node(attributeData));
COLLADASaxFWL::node__AttributeData attrData;
attrData.present_attributes = 0;
attrData.id = attributeData.id;
attrData.name = attributeData.name;
attrData.sid = attributeData.sid;
switch (attributeData.type) {
case COLLADASaxFWL14::ENUM__NodeType__JOINT: attrData.type=COLLADASaxFWL::ENUM__NodeType__JOINT; break;
case COLLADASaxFWL14::ENUM__NodeType__NODE: attrData.type=COLLADASaxFWL::ENUM__NodeType__NODE; break;
case COLLADASaxFWL14::ENUM__NodeType__COUNT: attrData.type=COLLADASaxFWL::ENUM__NodeType__INVALID; break;
case COLLADASaxFWL14::ENUM__NodeType__NOT_PRESENT: attrData.type=COLLADASaxFWL::ENUM__NodeType__NOT_PRESENT; break;
}
if ( (attributeData.present_attributes & COLLADASaxFWL14::node__AttributeData::ATTRIBUTE_LAYER_PRESENT) == COLLADASaxFWL14::node__AttributeData::ATTRIBUTE_LAYER_PRESENT ) {
    attrData.layer = attributeData.layer;
    attrData.present_attributes |= COLLADASaxFWL::node__AttributeData::ATTRIBUTE_LAYER_PRESENT;
}
return mLoader->begin__node(attrData);
}